

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::XmlSerializer::ImportVertices(XmlSerializer *this,aiMesh *mesh)

{
  ulong uVar1;
  aiVector3t<float> *__src;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  aiVector3D *__s;
  size_t __n;
  aiVector3D aVar6;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  aiVector3t<float> local_68;
  aiVector3t<float> *local_58;
  iterator iStack_50;
  aiVector3t<float> *local_48;
  aiMesh *local_38;
  
  local_58 = (aiVector3t<float> *)0x0;
  iStack_50._M_current = (aiVector3t<float> *)0x0;
  local_48 = (aiVector3t<float> *)0x0;
  while( true ) {
    bVar3 = ReadToEndElement(this,(string *)XmlTag::vertices_abi_cxx11_);
    iVar2._M_current = iStack_50._M_current;
    __src = local_58;
    if (!bVar3) break;
    (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    iVar4 = std::__cxx11::string::compare(XmlTag::vertex_abi_cxx11_);
    if (iVar4 == 0) {
      aVar6 = ReadVertex(this);
      local_68.z = aVar6.z;
      local_68._0_8_ = aVar6._0_8_;
      if (iStack_50._M_current == local_48) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_58,
                   iStack_50,&local_68);
      }
      else {
        (iStack_50._M_current)->z = local_68.z;
        (iStack_50._M_current)->x = local_68.x;
        (iStack_50._M_current)->y = local_68.y;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
    }
  }
  __n = (long)iStack_50._M_current - (long)local_58;
  uVar5 = (int)((long)__n >> 2) * -0x55555555;
  mesh->mNumVertices = uVar5;
  uVar1 = (ulong)uVar5 * 0xc;
  local_38 = mesh;
  __s = (aiVector3D *)operator_new__(uVar1);
  if ((ulong)uVar5 != 0) {
    memset(__s,0,((uVar1 - 0xc) / 0xc) * 0xc + 0xc);
  }
  local_38->mVertices = __s;
  if (iVar2._M_current != __src) {
    memmove(__s,__src,__n);
  }
  if (__src != (aiVector3t<float> *)0x0) {
    operator_delete(__src);
  }
  return;
}

Assistant:

void ImportVertices(aiMesh* mesh) {
        std::vector<aiVector3D> vertices;
        while(ReadToEndElement(D3MF::XmlTag::vertices)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::vertex) {
                vertices.push_back(ReadVertex());
            }
        }
        mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];

        std::copy(vertices.begin(), vertices.end(), mesh->mVertices);
    }